

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDeleteView.cpp
# Opt level: O2

void __thiscall RoomDeleteView::display(RoomDeleteView *this)

{
  display((RoomDeleteView *)&this[-1].super_DeleteView<Room>.super_View.menuChoices);
  return;
}

Assistant:

void RoomDeleteView::display() {
    cout << "Enter the Room number to be deleted:\n. "
            "Note that all slots with the room number entered will also be deleted so be careful.\n";
    Room *room = Room::findByRoomNumber(Input::getInt());
    if (room) {
        context.requestObjectId = room->getId();
        DeleteView::display();
        for (auto &it :Slot::all()) {
            if (it.second.getRoom().getRoomNumber() == room->getRoomNumber())
                it.second.remove();
        }
        cout << "Room #" + to_string(room->getRoomNumber()) + " successfuly deleted.\n";
    } else {
        cout << "No room with this number exists.\n";
    }
    response->view = Controller::getInstance().getView("admin-panel");
}